

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

ArenaMemoryDataSummary * __thiscall
JsUtil::
BaseDictionary<char16_t_*,_ArenaMemoryDataSummary_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Item(BaseDictionary<char16_t_*,_ArenaMemoryDataSummary_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *this,char16_t **key)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ArenaMemoryDataSummary **ppAVar4;
  undefined8 *in_FS_OFFSET;
  int i;
  char16_t **key_local;
  BaseDictionary<char16_t_*,_ArenaMemoryDataSummary_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  iVar3 = FindEntry(this,key);
  if (iVar3 < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0xed,"(i >= 0)","i >= 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  ppAVar4 = anon_unknown_4::
            ValueEntry<ArenaMemoryDataSummary_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<char16_t_*,_ArenaMemoryDataSummary_*>_>
            ::Value((ValueEntry<ArenaMemoryDataSummary_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<char16_t_*,_ArenaMemoryDataSummary_*>_>
                     *)(this->entries + iVar3));
  return *ppAVar4;
}

Assistant:

TValue Item(const TKey& key)
        {
            int i = FindEntry(key);
            Assert(i >= 0);
            return entries[i].Value();
        }